

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::addAll(UnicodeSet *this,UnicodeString *s)

{
  int32_t iVar1;
  uint c;
  int iVar2;
  undefined4 local_20;
  int32_t i;
  UChar32 cp;
  UnicodeString *s_local;
  UnicodeSet *this_local;
  
  local_20 = 0;
  while( true ) {
    iVar1 = UnicodeString::length(s);
    if (iVar1 <= local_20) break;
    c = UnicodeString::char32At(s,local_20);
    add(this,c);
    iVar2 = 2;
    if (c < 0x10000) {
      iVar2 = 1;
    }
    local_20 = iVar2 + local_20;
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::addAll(const UnicodeString& s) {
    UChar32 cp;
    for (int32_t i = 0; i < s.length(); i += U16_LENGTH(cp)) {
        cp = s.char32At(i);
        add(cp);
    }
    return *this;
}